

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void testIoPerformance(void)

{
  uint uVar1;
  int iVar2;
  C *pCVar3;
  uint64_t uVar4;
  size_t __nbytes;
  Record rec_1;
  RecordFileHdr hdr;
  void *p;
  size_t recSize;
  Record *rec;
  uint64_t endOffset;
  RecordFileHdr *hdr3;
  RecordFileHdr *hdr2;
  MappedFile mappedFileDst;
  MappedFile mappedFileSrc;
  Rec staticRec;
  Array<char,_axl::sl::ArrayDetails<char>_> buffer;
  uint64_t offset;
  uint64_t time;
  uint64_t baseTimestamp;
  bool result;
  File simpleFileDst;
  File simpleFileSrc;
  uint64_t in_stack_fffffffffffff788;
  MappedFile *in_stack_fffffffffffff790;
  char *in_stack_fffffffffffff798;
  MappedFile *in_stack_fffffffffffff7a0;
  MappedFile *in_stack_fffffffffffff7b0;
  undefined5 in_stack_fffffffffffff7b8;
  undefined1 in_stack_fffffffffffff7bd;
  undefined1 in_stack_fffffffffffff7be;
  undefined1 in_stack_fffffffffffff7bf;
  undefined1 uVar5;
  uint64_t in_stack_fffffffffffff7c0;
  MappedFile *in_stack_fffffffffffff7c8;
  bool local_7f2;
  undefined1 local_788 [16];
  uint local_778;
  undefined1 local_770 [16];
  ulong local_760;
  byte local_719;
  char local_718 [120];
  void *local_6a0;
  long local_698;
  void *local_690;
  ulong local_688;
  void *local_680;
  void *local_678;
  byte local_649;
  char local_648 [32];
  char local_628 [32];
  MappedFile local_608;
  MappedFile local_558;
  undefined1 local_4a8 [16];
  undefined4 local_498;
  Array local_90 [24];
  ulong local_78;
  long local_70;
  uint64_t local_68;
  undefined4 local_5c;
  char local_38 [35];
  bool local_15;
  File local_8;
  File local_4;
  
  axl::io::File::File((File *)0x115c14);
  axl::io::File::File((File *)0x115c21);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)in_stack_fffffffffffff7a0,
             in_stack_fffffffffffff798);
  uVar1 = axl::io::File::open(&local_4,local_38,1);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x115c69);
  local_15 = (bool)((byte)uVar1 & 1);
  if ((uVar1 & 1) == 0) {
    axl::err::getLastErrorDescription();
    pCVar3 = axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                       ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
                        in_stack_fffffffffffff790);
    printf("can\'t open %s: %s\n",testIoPerformance::fileNameSrc,pCVar3);
    axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x115cd9);
    local_5c = 1;
  }
  else {
    axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::Array
              ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x115d74);
    memset(local_4a8,0,0x418);
    local_498 = 0x400;
    axl::io::MappedFile::MappedFile(in_stack_fffffffffffff7b0);
    axl::io::MappedFile::MappedFile(in_stack_fffffffffffff7b0);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
              ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)in_stack_fffffffffffff7a0,
               in_stack_fffffffffffff798);
    iVar2 = axl::io::MappedFile::open(&local_558,local_628,1);
    local_15 = (bool)((byte)iVar2 & 1);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
              ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x115e09);
    local_649 = 0;
    local_7f2 = false;
    if ((local_15 & 1U) != 0) {
      axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
                ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)in_stack_fffffffffffff7a0
                 ,in_stack_fffffffffffff798);
      local_649 = 1;
      uVar1 = axl::io::MappedFile::open(&local_608,local_648,0);
      local_7f2 = false;
      if ((uVar1 & 1) != 0) {
        local_7f2 = axl::io::MappedFile::setSize
                              (in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
      }
    }
    local_15 = local_7f2;
    if ((local_649 & 1) != 0) {
      axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
                ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x115ece);
    }
    if ((local_15 & 1U) == 0) {
      axl::err::getLastErrorDescription();
      pCVar3 = axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                         ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
                          in_stack_fffffffffffff790);
      printf("error: %s\n",pCVar3);
      axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
                ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x115f21);
      local_5c = 1;
    }
    else {
      printf("testing mapped file...\n");
      local_68 = axl::sys::getTimestamp();
      local_678 = axl::io::MappedFile::view
                            (in_stack_fffffffffffff7a0,(uint64_t)in_stack_fffffffffffff798,
                             (size_t)in_stack_fffffffffffff790,
                             SUB81(in_stack_fffffffffffff788 >> 0x38,0));
      local_680 = axl::io::MappedFile::view
                            (in_stack_fffffffffffff7a0,(uint64_t)in_stack_fffffffffffff798,
                             (size_t)in_stack_fffffffffffff790,
                             SUB81(in_stack_fffffffffffff788 >> 0x38,0));
      __wrap_memcpy(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798,
                    (size_t)in_stack_fffffffffffff790);
      local_78 = 0x30;
      local_688 = *(long *)((long)local_678 + 0x10) + 0x30;
      for (; local_78 < local_688; local_78 = local_698 + local_78) {
        local_690 = axl::io::MappedFile::view
                              (in_stack_fffffffffffff7a0,(uint64_t)in_stack_fffffffffffff798,
                               (size_t)in_stack_fffffffffffff790,
                               SUB81(in_stack_fffffffffffff788 >> 0x38,0));
        local_698 = (ulong)*(uint *)((long)local_690 + 0x10) + 0x18;
        if (*(int *)((long)local_690 + 0x10) != 0) {
          local_690 = axl::io::MappedFile::view
                                (in_stack_fffffffffffff7a0,(uint64_t)in_stack_fffffffffffff798,
                                 (size_t)in_stack_fffffffffffff790,
                                 SUB81(in_stack_fffffffffffff788 >> 0x38,0));
        }
        local_6a0 = axl::io::MappedFile::view
                              (in_stack_fffffffffffff7a0,(uint64_t)in_stack_fffffffffffff798,
                               (size_t)in_stack_fffffffffffff790,
                               SUB81(in_stack_fffffffffffff788 >> 0x38,0));
        __wrap_memcpy(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798,
                      (size_t)in_stack_fffffffffffff790);
      }
      uVar4 = axl::sys::getTimestamp();
      local_70 = uVar4 - local_68;
      uVar4 = local_68;
      axl::sys::Time::Time((Time *)in_stack_fffffffffffff790,in_stack_fffffffffffff788,0);
      axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
                ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)in_stack_fffffffffffff7a0
                 ,in_stack_fffffffffffff798);
      axl::sys::Time::format
                ((Time *)CONCAT17(in_stack_fffffffffffff7bf,
                                  CONCAT16(in_stack_fffffffffffff7be,
                                           CONCAT15(in_stack_fffffffffffff7bd,
                                                    in_stack_fffffffffffff7b8))),
                 (StringRef *)in_stack_fffffffffffff7b0);
      pCVar3 = axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                         ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
                          in_stack_fffffffffffff790);
      printf("Done: %s\n",pCVar3);
      axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
                ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x116276);
      axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
                ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x116283);
      __nbytes = CONCAT71((int7)(uVar4 >> 8),local_15);
      local_719 = 0;
      uVar5 = false;
      if ((local_15 & 1U) != 0) {
        axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
                  ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)
                   in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
        local_719 = 1;
        uVar1 = axl::io::File::open(&local_8,local_718,0);
        in_stack_fffffffffffff7be = (undefined1)uVar1;
        __nbytes = CONCAT71((int7)(__nbytes >> 8),in_stack_fffffffffffff7be);
        uVar5 = false;
        if ((uVar1 & 1) != 0) {
          in_stack_fffffffffffff7bd =
               axl::io::File::setSize(&in_stack_fffffffffffff790->m_file,in_stack_fffffffffffff788);
          uVar5 = in_stack_fffffffffffff7bd;
        }
      }
      local_15 = (bool)uVar5;
      if ((local_719 & 1) != 0) {
        axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
                  ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x116330);
      }
      if ((local_15 & 1U) == 0) {
        axl::err::getLastErrorDescription();
        pCVar3 = axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                           ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
                            in_stack_fffffffffffff790);
        printf("error: %s\n",pCVar3);
        axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
                  ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x116383);
        local_5c = 1;
      }
      else {
        printf("testing simple file...\n");
        local_68 = axl::sys::getTimestamp();
        axl::io::File::read(&local_4,(int)local_770,(void *)0x30,__nbytes);
        axl::io::File::write(&local_8,(int)local_770,(void *)0x30,__nbytes);
        for (local_78 = 0; local_78 < local_760; local_78 = (ulong)local_778 + 0x18 + local_78) {
          axl::io::File::read(&local_4,(int)local_788,(void *)0x18,__nbytes);
          if (local_778 != 0) {
            axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::setCount
                      ((Array<char,_axl::sl::ArrayDetails<char>_> *)in_stack_fffffffffffff790,
                       in_stack_fffffffffffff788);
            in_stack_fffffffffffff7a0 =
                 (MappedFile *)
                 axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::p
                           ((Array<char,_axl::sl::ArrayDetails<char>_> *)in_stack_fffffffffffff790);
            axl::io::File::read(&local_4,(int)in_stack_fffffffffffff7a0,(void *)(ulong)local_778,
                                __nbytes);
          }
          axl::io::File::write(&local_8,(int)local_788,(void *)0x18,__nbytes);
          in_stack_fffffffffffff798 = axl::sl::Array::operator_cast_to_char_(local_90);
          axl::io::File::write
                    (&local_8,(int)in_stack_fffffffffffff798,(void *)(ulong)local_778,__nbytes);
        }
        in_stack_fffffffffffff790 = (MappedFile *)axl::sys::getTimestamp();
        local_70 = (long)in_stack_fffffffffffff790 - local_68;
        axl::sys::Time::Time((Time *)in_stack_fffffffffffff790,in_stack_fffffffffffff788,0);
        axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
                  ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)
                   in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
        axl::sys::Time::format
                  ((Time *)CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffff7be,
                                                   CONCAT15(in_stack_fffffffffffff7bd,
                                                            in_stack_fffffffffffff7b8))),
                   (StringRef *)in_stack_fffffffffffff7b0);
        pCVar3 = axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                           ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
                            in_stack_fffffffffffff790);
        printf("Done: %s\n",pCVar3);
        axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
                  ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x11663b);
        axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
                  ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x116648);
        local_5c = 0;
      }
    }
    axl::io::MappedFile::~MappedFile(in_stack_fffffffffffff790);
    axl::io::MappedFile::~MappedFile(in_stack_fffffffffffff790);
    axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::~Array
              ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x11667a);
  }
  axl::io::File::~File((File *)0x116687);
  axl::io::File::~File((File *)0x116694);
  return;
}

Assistant:

void
testIoPerformance() {
	#define _READ_ONLY 0
	#define _DUMMY_WRITE 0

	io::File simpleFileSrc;
#if (!_READ_ONLY)
	io::File simpleFileDst;
#endif

	static char fileNameSrc[] = "G:/Temp/Test MTK TCP/Test MTK TCP.njlog";
	static char fileNameDst_s[] = "G:/Temp/Test MTK TCP/Test MTK TCP - 2.njlog";
	static char fileNameDst_m[] = "G:/Temp/Test MTK TCP/Test MTK TCP - 3.njlog";

	bool result = simpleFileSrc.open(fileNameSrc, io::FileFlag_ReadOnly);
	if (!result) {
		printf("can't open %s: %s\n", fileNameSrc, err::getLastErrorDescription().sz());
		return;
	}

	uint64_t baseTimestamp;
	uint64_t time;
	uint64_t offset;

	sl::Array<char> buffer;

	struct Rec: Record {
		char m_data[1024];
	};

	Rec staticRec;
	memset(&staticRec, 0, sizeof(staticRec));
	staticRec.m_dataSize = sizeof(staticRec.m_data);

	io::MappedFile mappedFileSrc;
	io::MappedFile mappedFileDst;

	result = mappedFileSrc.open(fileNameSrc, io::FileFlag_ReadOnly);

#if (!_READ_ONLY)
	result =
		result &&
		mappedFileDst.open(fileNameDst_m) &&
		mappedFileDst.setSize(0);
#endif

	if (!result) {
		printf("error: %s\n", err::getLastErrorDescription().sz());
		return;
	}

	printf("testing mapped file...\n");
	baseTimestamp = sys::getTimestamp();

	RecordFileHdr* hdr2 = (RecordFileHdr*)mappedFileSrc.view(0, sizeof(RecordFileHdr), true);

#if (!_READ_ONLY)
	RecordFileHdr* hdr3 = (RecordFileHdr*)mappedFileDst.view(0, sizeof(RecordFileHdr), true);
	*hdr3 = *hdr2;
#endif

	offset = sizeof(RecordFileHdr);
	uint64_t endOffset = offset + hdr2->m_totalRecordSize;

	while (offset < endOffset) {
#if (_DUMMY_WRITE)
		Record* rec = &staticRec;
		size_t recSize = sizeof(rec);
#else
		Record* rec = (Record*)mappedFileSrc.view(offset, sizeof(Record));
		size_t recSize = sizeof(Record) + rec->m_dataSize;
		if (rec->m_dataSize)
			rec = (Record*)mappedFileSrc.view(offset, recSize);
#endif

#if (!_READ_ONLY)
		void* p = mappedFileDst.view(offset, recSize);
		memcpy(p, rec, recSize);
#endif

		offset += recSize;
	}

	time = sys::getTimestamp() - baseTimestamp;
	printf("Done: %s\n", sys::Time(time, 0).format("%m.%s.%l").sz());

#if (!_READ_ONLY)
	result =
		result	&&
		simpleFileDst.open(fileNameDst_s) &&
		simpleFileDst.setSize(0);
#endif

	if (!result) {
		printf("error: %s\n", err::getLastErrorDescription().sz());
		return;
	}

	printf("testing simple file...\n");
	baseTimestamp = sys::getTimestamp();

	RecordFileHdr hdr;
	simpleFileSrc.read(&hdr, sizeof(hdr));

#if (!_READ_ONLY)
	simpleFileDst.write(&hdr, sizeof(hdr));
#endif

	offset = 0;
	while (offset < hdr.m_totalRecordSize) {
#if (!_DUMMY_WRITE)
		Record rec;
		simpleFileSrc.read(&rec, sizeof(rec));
		if (rec.m_dataSize) {
			buffer.setCount(rec.m_dataSize);
			simpleFileSrc.read(buffer.p(), rec.m_dataSize);
		}

#	if (!_READ_ONLY)
		simpleFileDst.write(&rec, sizeof(rec));
		simpleFileDst.write(buffer, rec.m_dataSize);
#	endif

		offset += sizeof(rec) + rec.m_dataSize;
#else
		simpleFileDst.write(&staticRec, sizeof(staticRec));
		offset += sizeof(staticRec);
#endif
	}

	time = sys::getTimestamp() - baseTimestamp;
	printf("Done: %s\n", sys::Time(time, 0).format("%m.%s.%l").sz());
}